

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_> *
args::EitherFlag::GetShort(initializer_list<args::EitherFlag> flags)

{
  const_iterator pEVar1;
  unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_> *in_RDI;
  pair<std::__detail::_Node_iterator<char,_true,_false>,_bool> pVar2;
  EitherFlag *flag;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<args::EitherFlag> *__range2;
  unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_> *shortFlags;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  _Node_iterator_base<char,_false> in_stack_ffffffffffffff88;
  unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_> *this;
  const_iterator local_30;
  initializer_list<args::EitherFlag> local_18;
  
  this = in_RDI;
  std::unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>::
  unordered_set((unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_> *)
                0x11d040);
  local_30 = std::initializer_list<args::EitherFlag>::begin(&local_18);
  pEVar1 = std::initializer_list<args::EitherFlag>::end
                     ((initializer_list<args::EitherFlag> *)
                      CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  for (; local_30 != pEVar1; local_30 = local_30 + 1) {
    if ((local_30->isShort & 1U) != 0) {
      pVar2 = std::unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>
              ::insert(this,(value_type *)in_stack_ffffffffffffff88._M_cur);
      in_stack_ffffffffffffff88._M_cur =
           (__node_type *)pVar2.first.super__Node_iterator_base<char,_false>._M_cur;
    }
  }
  return in_RDI;
}

Assistant:

static std::unordered_set<char> GetShort(std::initializer_list<EitherFlag> flags)
        {
            std::unordered_set<char>  shortFlags;
            for (const EitherFlag &flag: flags)
            {
                if (flag.isShort)
                {
                    shortFlags.insert(flag.shortFlag);
                }
            }
            return shortFlags;
        }